

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O0

istream * anon_unknown.dwarf_20aaf::operator>>(istream *in,RGB *rgb)

{
  void *pvVar1;
  uint8_t local_1e [2];
  uint8_t local_1c [2];
  uint8_t local_1a [2];
  short b;
  short g;
  RGB *pRStack_18;
  short r;
  RGB *rgb_local;
  istream *in_local;
  
  pRStack_18 = rgb;
  rgb_local = (RGB *)in;
  pvVar1 = (void *)std::istream::operator>>(in,(short *)local_1a);
  pvVar1 = (void *)std::istream::operator>>(pvVar1,(short *)local_1c);
  std::istream::operator>>(pvVar1,(short *)local_1e);
  pRStack_18->r = local_1a[0];
  pRStack_18->g = local_1c[0];
  pRStack_18->b = local_1e[0];
  return (istream *)rgb_local;
}

Assistant:

std::istream& operator>>(std::istream& in, RGB& rgb)
{
  short r, g, b;
  in >> r >> g >> b;
  rgb.r = r;
  rgb.g = g;
  rgb.b = b;
  return in;
}